

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O0

bool __thiscall MP1Node::heartbeatRepHandler(MP1Node *this,void *env,char *data,int size)

{
  long lVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  ostream *poVar5;
  pointer pMVar6;
  __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
  local_98;
  __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
  local_90;
  iterator entry;
  short port;
  string local_58 [32];
  int local_38;
  undefined4 local_34;
  int id;
  Address replierAddr;
  int size_local;
  char *data_local;
  void *env_local;
  MP1Node *this_local;
  
  replierAddr.addr._0_4_ = size;
  unique0x10000285 = data;
  poVar5 = std::operator<<((ostream *)&std::cout,"start heartbeatRepHandler...");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  if (5 < (int)replierAddr.addr._0_4_) {
    Address::Address((Address *)&stack0xffffffffffffffcc);
    id._0_2_ = *(undefined2 *)(stack0xffffffffffffffd8 + 4);
    local_34 = *(undefined4 *)stack0xffffffffffffffd8;
    Address::getAddress_abi_cxx11_((Address *)local_58);
    iVar4 = getIdFromAddress(this,local_58);
    std::__cxx11::string::~string((string *)local_58);
    local_38 = iVar4;
    Address::getAddress_abi_cxx11_((Address *)&entry);
    sVar3 = getPortFromAddress(this,(string *)&entry);
    std::__cxx11::string::~string((string *)&entry);
    local_90._M_current =
         (MemberListEntry *)
         std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::begin
                   (&this->memberNode->memberList);
    while( true ) {
      local_98._M_current =
           (MemberListEntry *)
           std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::end
                     (&this->memberNode->memberList);
      bVar2 = __gnu_cxx::operator!=(&local_90,&local_98);
      if (!bVar2) break;
      pMVar6 = __gnu_cxx::
               __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
               ::operator->(&local_90);
      if ((pMVar6->id == local_38) &&
         (pMVar6 = __gnu_cxx::
                   __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
                   ::operator->(&local_90), pMVar6->port == sVar3)) {
        pMVar6 = __gnu_cxx::
                 __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
                 ::operator->(&local_90);
        iVar4 = Params::getcurrtime(this->par);
        MemberListEntry::settimestamp(pMVar6,(long)iVar4);
        pMVar6 = __gnu_cxx::
                 __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
                 ::operator->(&local_90);
        lVar1 = pMVar6->heartbeat;
        pMVar6 = __gnu_cxx::
                 __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
                 ::operator->(&local_90);
        pMVar6->heartbeat = lVar1 + 1;
        return true;
      }
      __gnu_cxx::
      __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
      ::operator++(&local_90,0);
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"...end heartbeatRepHandler.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  return false;
}

Assistant:

bool MP1Node::heartbeatRepHandler(void *env, char *data, int size) {
    cout << "start heartbeatRepHandler..." << endl;

    if (size < (int)(sizeof(memberNode->addr.addr))) {
        return false;
    }

    Address replierAddr;
    memcpy(&replierAddr.addr, data, sizeof(memberNode->addr.addr));

    int id = getIdFromAddress(replierAddr.getAddress());
    short port = getPortFromAddress(replierAddr.getAddress());

    for (vector<MemberListEntry>::iterator entry = memberNode->memberList.begin(); entry != memberNode->memberList.end(); entry++) {
        if (entry->id == id && entry->port == port) {
            entry->settimestamp( par->getcurrtime() );
            entry->heartbeat = entry->heartbeat + 1;
            return true;
        }
    }

    cout << "...end heartbeatRepHandler." << endl;
    return false;
}